

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache_test.cc
# Opt level: O0

void __thiscall leveldb::CacheTest_Erase_Test::CacheTest_Erase_Test(CacheTest_Erase_Test *this)

{
  CacheTest_Erase_Test *this_local;
  
  CacheTest::CacheTest(&this->super_CacheTest);
  (this->super_CacheTest).super_Test._vptr_Test = (_func_int **)&PTR__CacheTest_Erase_Test_00181b50;
  return;
}

Assistant:

TEST_F(CacheTest, Erase) {
  Erase(200);
  ASSERT_EQ(0, deleted_keys_.size());

  Insert(100, 101);
  Insert(200, 201);
  Erase(100);
  ASSERT_EQ(-1, Lookup(100));
  ASSERT_EQ(201, Lookup(200));
  ASSERT_EQ(1, deleted_keys_.size());
  ASSERT_EQ(100, deleted_keys_[0]);
  ASSERT_EQ(101, deleted_values_[0]);

  Erase(100);
  ASSERT_EQ(-1, Lookup(100));
  ASSERT_EQ(201, Lookup(200));
  ASSERT_EQ(1, deleted_keys_.size());
}